

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpnghandler.cpp
# Opt level: O0

Format __thiscall QPngHandlerPrivate::readImageFormat(QPngHandlerPrivate *this)

{
  char cVar1;
  int iVar2;
  long in_RDI;
  long in_FS_OFFSET;
  Format format;
  int num_palette;
  png_colorp palette;
  int color_type;
  int bit_depth;
  png_uint_32 height;
  png_uint_32 width;
  Format local_34;
  int local_24;
  undefined1 *local_20;
  uint local_18;
  int local_14 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_14[2] = 0;
  local_14[1] = 0;
  local_14[0] = 0;
  local_18 = 0;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_24 = -0x55555556;
  png_get_IHDR(*(undefined8 *)(in_RDI + 0x50),*(undefined8 *)(in_RDI + 0x58),local_14 + 2,
               local_14 + 1,local_14,&local_18,0,0,0);
  if (local_18 == 0) {
    if ((local_14[0] == 1) &&
       (cVar1 = png_get_channels(*(undefined8 *)(in_RDI + 0x50),*(undefined8 *)(in_RDI + 0x58)),
       cVar1 == '\x01')) {
      local_34 = Format_Mono;
    }
    else if (local_14[0] == 0x10) {
      iVar2 = png_get_valid(*(undefined8 *)(in_RDI + 0x50),*(undefined8 *)(in_RDI + 0x58),0x10);
      local_34 = Format_Grayscale16;
      if (iVar2 != 0) {
        local_34 = Format_RGBA64;
      }
    }
    else if ((local_14[0] == 8) &&
            (iVar2 = png_get_valid(*(undefined8 *)(in_RDI + 0x50),*(undefined8 *)(in_RDI + 0x58),
                                   0x10), iVar2 == 0)) {
      local_34 = Format_Grayscale8;
    }
    else {
      local_34 = Format_Indexed8;
    }
  }
  else if (((local_18 == 3) &&
           (iVar2 = png_get_PLTE(*(undefined8 *)(in_RDI + 0x50),*(undefined8 *)(in_RDI + 0x58),
                                 &local_20,&local_24), iVar2 != 0)) && (local_24 < 0x101)) {
    local_34 = Format_Indexed8;
    if (local_14[0] == 1) {
      local_34 = Format_Mono;
    }
  }
  else if ((local_14[0] == 0x10) && ((local_18 & 1) == 0)) {
    local_34 = Format_RGBA64;
    if (((local_18 & 4) == 0) &&
       (iVar2 = png_get_valid(*(undefined8 *)(in_RDI + 0x50),*(undefined8 *)(in_RDI + 0x58),0x10),
       iVar2 == 0)) {
      local_34 = Format_RGBX64;
    }
  }
  else {
    local_34 = Format_ARGB32;
    if (((local_18 & 4) == 0) &&
       (iVar2 = png_get_valid(*(undefined8 *)(in_RDI + 0x50),*(undefined8 *)(in_RDI + 0x58),0x10),
       iVar2 == 0)) {
      local_34 = Format_RGB32;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_34;
}

Assistant:

QImage::Format QPngHandlerPrivate::readImageFormat()
{
        QImage::Format format = QImage::Format_Invalid;
        png_uint_32 width = 0, height = 0;
        int bit_depth = 0, color_type = 0;
        png_colorp palette;
        int num_palette;
        png_get_IHDR(png_ptr, info_ptr, &width, &height, &bit_depth, &color_type, nullptr, nullptr, nullptr);
        if (color_type == PNG_COLOR_TYPE_GRAY) {
            // Black & White or grayscale
            if (bit_depth == 1 && png_get_channels(png_ptr, info_ptr) == 1) {
                format = QImage::Format_Mono;
            } else if (bit_depth == 16) {
                format = png_get_valid(png_ptr, info_ptr, PNG_INFO_tRNS) ? QImage::Format_RGBA64 : QImage::Format_Grayscale16;
            } else if (bit_depth == 8 && !png_get_valid(png_ptr, info_ptr, PNG_INFO_tRNS)) {
                format = QImage::Format_Grayscale8;
            } else {
                format = QImage::Format_Indexed8;
            }
        } else if (color_type == PNG_COLOR_TYPE_PALETTE
                   && png_get_PLTE(png_ptr, info_ptr, &palette, &num_palette)
                   && num_palette <= 256)
        {
            // 1-bit and 8-bit color
            format = bit_depth == 1 ? QImage::Format_Mono : QImage::Format_Indexed8;
        } else if (bit_depth == 16 && !(color_type & PNG_COLOR_MASK_PALETTE)) {
            format = QImage::Format_RGBA64;
            if (!(color_type & PNG_COLOR_MASK_ALPHA) && !png_get_valid(png_ptr, info_ptr, PNG_INFO_tRNS))
                format = QImage::Format_RGBX64;
        } else {
            // 32-bit
            format = QImage::Format_ARGB32;
            // Only add filler if no alpha, or we can get 5 channel data.
            if (!(color_type & PNG_COLOR_MASK_ALPHA)
                && !png_get_valid(png_ptr, info_ptr, PNG_INFO_tRNS)) {
                // We want 4 bytes, but it isn't an alpha channel
                format = QImage::Format_RGB32;
            }
        }

        return format;
}